

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

bool __thiscall Board::load(Board *this,string *path)

{
  pointer *ppTVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  char cVar3;
  long lVar4;
  bool bVar5;
  Tile t;
  vector<Tile,_std::allocator<Tile>_> tiles;
  string buffer;
  regex nonNumeric;
  ifstream stream;
  Tile local_2b0;
  vector<Tile,_std::allocator<Tile>_> local_2a8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  long local_278;
  char local_270;
  undefined7 uStack_26f;
  Board *local_260;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_258;
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)path,_S_in);
  local_280._M_current = &local_270;
  local_278 = 0;
  local_270 = '\0';
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
    std::istream::seekg((long)local_238,_S_beg);
    cVar3 = std::istream::tellg();
    std::__cxx11::string::resize((ulong)&local_280,cVar3);
    std::istream::seekg(local_238,0,0);
    std::istream::read((char *)local_238,(long)local_280._M_current);
    std::ifstream::close();
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_258,"[^0-9]",0x10);
    ppTVar1 = &local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_finish = (Tile *)0x0;
    local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
    local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)ppTVar1;
    std::
    __regex_replace<std::back_insert_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::__cxx11::regex_traits<char>,char>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8,
               local_280,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_280._M_current + local_278),&local_258,"",0,0);
    std::__cxx11::string::operator=((string *)&local_280,(string *)&local_2a8);
    if (local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)ppTVar1) {
      operator_delete(local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)&(local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage)->value + 1)
                     );
    }
    _Var2._M_current = local_280._M_current;
    bVar5 = local_278 == 0x51;
    if (bVar5) {
      local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_finish = (Tile *)0x0;
      local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (Tile *)0x0;
      lVar4 = 0;
      local_260 = this;
      do {
        if ((int)_Var2._M_current[lVar4] - 0x30 == Empty) {
          local_2b0.value = Empty;
          local_2b0.status = Empty;
        }
        else {
          local_2b0.status = Solved;
          local_2b0.value = (int)_Var2._M_current[lVar4] - 0x30;
        }
        if (local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Tile,std::allocator<Tile>>::_M_realloc_insert<Tile_const&>
                    ((vector<Tile,std::allocator<Tile>> *)&local_2a8,
                     (iterator)
                     local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_2b0);
        }
        else {
          *local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data
           ._M_finish = local_2b0;
          local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x51);
      std::vector<Tile,_std::allocator<Tile>_>::operator=(&local_260->_tiles,&local_2a8);
      if (local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2a8.super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_258);
  }
  else {
    bVar5 = false;
  }
  if (local_280._M_current != &local_270) {
    operator_delete(local_280._M_current,CONCAT71(uStack_26f,local_270) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return bVar5;
}

Assistant:

bool Board::load(const std::string &path)
{
	std::ifstream stream(path);
	std::string buffer;

	if (!stream)
		return false;

	stream.seekg(0, std::ios::end);
	buffer.resize(stream.tellg());
	stream.seekg(0);
	stream.read(&buffer[0], buffer.size());
	stream.close();

	std::regex nonNumeric("[^0-9]");

	buffer = std::regex_replace(buffer, nonNumeric, "");

	if (buffer.size() != 81)
		return false;

	std::vector<Tile> tiles;

	for (auto &c : buffer)
	{
		auto t = Tile{};
		t.value = (TileValue)(c - '0');

		if (t.value == TileValue::Empty)
			t.status = TileStatus::Empty;
		else
			t.status = TileStatus::Solved;

		tiles.push_back(t);
	}

	_tiles = tiles;
	return true;
}